

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O2

void google::protobuf::compiler::annotation_test_util::AddFile
               (string_view filename,string_view data)

{
  Nonnull<const_char_*> failure_msg;
  string_view contents;
  Status local_100;
  string local_f8;
  tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_d8;
  LogMessage local_d0;
  LogMessage local_b8 [3];
  AlphaNum local_88;
  AlphaNum local_58;
  
  TestTempDir_abi_cxx11_();
  local_b8[0].errno_saver_.saved_errno_ = local_d0.errno_saver_.saved_errno_;
  local_b8[0]._4_4_ = local_d0._4_4_;
  local_b8[0].data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )local_d8.
                     super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                     ._M_head_impl;
  local_58.piece_ = absl::lts_20250127::NullSafeStringView("/");
  local_88.piece_._M_len = filename._M_len;
  local_88.piece_._M_str = filename._M_str;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_f8,(lts_20250127 *)local_b8,&local_58,&local_88,&local_58);
  contents._M_str = (char *)data._M_len;
  contents._M_len = (size_t)&local_100;
  File::WriteStringToFile(contents,(string *)data._M_str);
  if (local_100.rep_ == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            (&local_100,
                             "File::SetContents( absl::StrCat(TestTempDir(), \"/\", filename), data, true) is OK"
                            );
  }
  absl::lts_20250127::Status::~Status(&local_100);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (local_100.rep_ == 1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x35,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_b8);
}

Assistant:

void AddFile(absl::string_view filename, absl::string_view data) {
  ABSL_CHECK_OK(File::SetContents(
      absl::StrCat(TestTempDir(), "/", filename), data, true));
}